

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O0

void * alsa_update_rw(ALLEGRO_THREAD *self,void *arg)

{
  snd_pcm_t *psVar1;
  int iVar2;
  undefined1 *puVar3;
  undefined4 uVar4;
  snd_pcm_sframes_t sVar5;
  ALSA_VOICE *voice_00;
  void *pvVar6;
  byte bVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  undefined1 **ppuVar11;
  undefined1 *local_78;
  byte local_6d;
  uint local_6c;
  undefined1 *puStack_68;
  uint iframes;
  void *buf;
  unsigned_long __vla_expr0;
  uint local_4c;
  undefined4 local_48;
  int bytes;
  int rc_1;
  int rc;
  snd_pcm_sframes_t err;
  snd_pcm_uframes_t frames;
  snd_pcm_state_t state;
  snd_pcm_state_t last_state;
  ALSA_VOICE *alsa_voice;
  ALLEGRO_VOICE *voice;
  void *arg_local;
  ALLEGRO_THREAD *self_local;
  
  _state = *(uint **)((long)arg + 0x50);
  frames._4_4_ = -1;
  alsa_voice = (ALSA_VOICE *)arg;
  voice = (ALLEGRO_VOICE *)arg;
  arg_local = self;
  uVar8 = _al_trace_prefix(__al_debug_channel,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                           ,0x1a5,"alsa_update_rw");
  ppuVar11 = &local_78;
  if ((uVar8 & 1) != 0) {
    _al_trace_suffix("ALSA update_rw thread started\n");
    ppuVar11 = &local_78;
  }
LAB_00116e05:
  do {
    pvVar6 = arg_local;
    *(undefined8 *)((long)ppuVar11 + -8) = 0x116e0e;
    bVar7 = al_get_thread_should_stop(pvVar6);
    if (((bVar7 ^ 0xff) & 1) == 0) {
LAB_001171cf:
      *(undefined8 *)((long)ppuVar11 + -8) = 0x1171f3;
      uVar8 = _al_trace_prefix(__al_debug_channel,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x1ff,"alsa_update_rw");
      if ((uVar8 & 1) != 0) {
        *(undefined8 *)((long)ppuVar11 + -8) = 0x117207;
        _al_trace_suffix("ALSA update_rw thread stopped\n");
      }
      return (void *)0x0;
    }
    if (((*(byte *)((long)_state + 0x11) & 1) != 0) && ((*(byte *)((long)_state + 0x12) & 1) == 0))
    {
      uVar9 = *(undefined8 *)(_state + 0xc);
      *(undefined8 *)((long)ppuVar11 + -8) = 0x116e3c;
      snd_pcm_drop(uVar9);
      psVar1 = alsa_voice->pcm_handle;
      *(undefined8 *)((long)ppuVar11 + -8) = 0x116e49;
      al_lock_mutex(psVar1);
      *(undefined1 *)((long)_state + 0x12) = 1;
      uVar9 = *(undefined8 *)&alsa_voice->mmapped;
      *(undefined8 *)((long)ppuVar11 + -8) = 0x116e5e;
      al_signal_cond(uVar9);
      psVar1 = alsa_voice->pcm_handle;
      *(undefined8 *)((long)ppuVar11 + -8) = 0x116e6b;
      al_unlock_mutex(psVar1);
    }
    if (((*(byte *)((long)_state + 0x11) & 1) == 0) && ((*(byte *)((long)_state + 0x12) & 1) != 0))
    {
      *(undefined1 *)((long)_state + 0x12) = 0;
    }
    if ((*(byte *)((long)_state + 0x12) & 1) == 0) {
      uVar9 = *(undefined8 *)(_state + 0xc);
      *(undefined8 *)((long)ppuVar11 + -8) = 0x116eff;
      frames._0_4_ = snd_pcm_state(uVar9);
      if ((int)frames != frames._4_4_) {
        *(undefined8 *)((long)ppuVar11 + -8) = 0x116f2b;
        uVar8 = _al_trace_prefix(__al_debug_channel,0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x1c1,"alsa_update_rw");
        iVar2 = (int)frames;
        if ((uVar8 & 1) != 0) {
          *(undefined8 *)((long)ppuVar11 + -8) = 0x116f39;
          snd_pcm_state_name(iVar2);
          *(undefined8 *)((long)ppuVar11 + -8) = 0x116f4a;
          _al_trace_suffix("state changed to: %s\n");
        }
        frames._4_4_ = (int)frames;
      }
      if ((int)frames == 1) {
        uVar9 = *(undefined8 *)(_state + 0xc);
        *(undefined8 *)((long)ppuVar11 + -8) = 0x116f63;
        bytes = snd_pcm_prepare(uVar9);
        *(undefined8 *)((long)ppuVar11 + -8) = 0x116f87;
        uVar8 = _al_trace_prefix(__al_debug_channel,0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x1c6,"alsa_update_rw");
        if ((uVar8 & 1) != 0) {
          *(undefined8 *)((long)ppuVar11 + -8) = 0x116f9e;
          _al_trace_suffix("snd_pcm_prepare returned: %d\n");
        }
      }
      else {
        if ((int)frames == 2) {
          uVar9 = *(undefined8 *)(_state + 0xc);
          *(undefined8 *)((long)ppuVar11 + -8) = 0x116fb6;
          local_48 = snd_pcm_start(uVar9);
          *(undefined8 *)((long)ppuVar11 + -8) = 0x116fda;
          uVar8 = _al_trace_prefix(__al_debug_channel,0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1cb,"alsa_update_rw");
          uVar4 = local_48;
          if ((uVar8 & 1) != 0) {
            *(undefined8 *)((long)ppuVar11 + -8) = 0x116ff1;
            _al_trace_suffix("snd_pcm_start returned: %d\n",uVar4);
          }
        }
        uVar9 = *(undefined8 *)(_state + 0xc);
        *(undefined8 *)((long)ppuVar11 + -8) = 0x117005;
        snd_pcm_wait(uVar9);
        uVar9 = *(undefined8 *)(_state + 0xc);
        *(undefined8 *)((long)ppuVar11 + -8) = 0x117012;
        _rc_1 = snd_pcm_avail_update(uVar9);
        if ((long)_rc_1 < 0) {
          if (_rc_1 != 0xffffffffffffffe0) {
            *(undefined8 *)((long)ppuVar11 + -8) = 0x117057;
            uVar8 = _al_trace_prefix(__al_debug_channel,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                     ,0x1d5,"alsa_update_rw");
            if ((uVar8 & 1) != 0) {
              iVar2 = (int)_rc_1;
              *(undefined8 *)((long)ppuVar11 + -8) = 0x11706a;
              uVar9 = snd_strerror(-iVar2);
              *(undefined8 *)((long)ppuVar11 + -8) = 0x11707b;
              _al_trace_suffix("Alsa r/w thread exited with error code %s.\n",uVar9);
            }
            goto LAB_001171cf;
          }
          uVar9 = *(undefined8 *)(_state + 0xc);
          *(undefined8 *)((long)ppuVar11 + -8) = 0x117031;
          snd_pcm_prepare(uVar9);
        }
        voice_00 = alsa_voice;
        if (_rc_1 != 0) {
          err = _rc_1;
          if (*(ulong *)(_state + 2) < _rc_1) {
            err = *(snd_pcm_sframes_t *)(_state + 2);
          }
          local_4c = (uint)err * *_state;
          __vla_expr0 = (unsigned_long)ppuVar11;
          puVar10 = (undefined1 *)
                    ((long)ppuVar11 + -((long)(ulong)local_4c + 0xfU & 0xfffffffffffffff0));
          buf = (void *)(ulong)local_4c;
          local_78 = puVar10;
          if ((((ulong)alsa_voice->poll_thread & 1) == 0) &&
             ((*(byte *)((long)_state + 0x12) & 1) == 0)) {
            *(undefined8 *)(puVar10 + -8) = 0x11710b;
            alsa_update_nonstream_voice
                      ((ALLEGRO_VOICE *)voice_00,&stack0xffffffffffffff98,(int *)&local_4c);
            err = (ulong)local_4c / (ulong)*_state;
          }
          else {
            if ((((ulong)alsa_voice->poll_thread & 1) != 0) &&
               ((*(byte *)((long)_state + 0x12) & 1) == 0)) {
              local_6c = (uint)err;
              *(undefined8 *)(puVar10 + -8) = 0x11714f;
              puStack_68 = (undefined1 *)
                           _al_voice_update(*(ALLEGRO_VOICE **)(puVar10 + 0x18),
                                            *(ALLEGRO_MUTEX **)(puVar10 + 0x10),
                                            *(uint **)(puVar10 + 8));
              if (puStack_68 != (undefined1 *)0x0) {
                err = (snd_pcm_sframes_t)local_6c;
                goto LAB_0011718d;
              }
            }
            *(undefined8 *)(puVar10 + -8) = 0x117183;
            al_fill_silence(*(void **)(puVar10 + 0x58),*(uint *)(puVar10 + 0x54),
                            *(ALLEGRO_AUDIO_DEPTH *)(puVar10 + 0x50),
                            *(ALLEGRO_CHANNEL_CONF *)(puVar10 + 0x4c));
            puStack_68 = local_78;
          }
LAB_0011718d:
          sVar5 = err;
          puVar3 = puStack_68;
          uVar9 = *(undefined8 *)(_state + 0xc);
          *(undefined8 *)(puVar10 + -8) = 0x1171a2;
          _rc_1 = snd_pcm_writei(uVar9,puVar3,sVar5);
          ppuVar11 = (undefined1 **)__vla_expr0;
          if (((long)_rc_1 < 0) && (_rc_1 == 0xffffffffffffffe0)) {
            uVar9 = *(undefined8 *)(_state + 0xc);
            *(undefined8 *)(puVar10 + -8) = 0x1171c1;
            snd_pcm_prepare(uVar9);
            ppuVar11 = (undefined1 **)__vla_expr0;
          }
        }
      }
      goto LAB_00116e05;
    }
    psVar1 = alsa_voice->pcm_handle;
    *(undefined8 *)((long)ppuVar11 + -8) = 0x116ea1;
    al_lock_mutex(psVar1);
    while( true ) {
      pvVar6 = arg_local;
      local_6d = 0;
      if ((*(byte *)((long)_state + 0x11) & 1) != 0) {
        *(undefined8 *)((long)ppuVar11 + -8) = 0x116ebb;
        local_6d = al_get_thread_should_stop(pvVar6);
        local_6d = local_6d ^ 0xff;
      }
      if ((local_6d & 1) == 0) break;
      uVar9 = *(undefined8 *)&alsa_voice->mmapped;
      *(undefined8 *)((long)ppuVar11 + -8) = 0x116ede;
      al_wait_cond(uVar9);
    }
    psVar1 = alsa_voice->pcm_handle;
    *(undefined8 *)((long)ppuVar11 + -8) = 0x116eed;
    al_unlock_mutex(psVar1);
  } while( true );
}

Assistant:

static void *alsa_update_rw(ALLEGRO_THREAD *self, void *arg)
{
   ALLEGRO_VOICE *voice = (ALLEGRO_VOICE*)arg;
   ALSA_VOICE *alsa_voice = (ALSA_VOICE*)voice->extra;
   snd_pcm_state_t last_state = -1;
   snd_pcm_state_t state;
   snd_pcm_uframes_t frames;
   snd_pcm_sframes_t err;

   ALLEGRO_INFO("ALSA update_rw thread started\n");

   while (!al_get_thread_should_stop(self)) {
      if (alsa_voice->stop && !alsa_voice->stopped) {
         snd_pcm_drop(alsa_voice->pcm_handle);
         al_lock_mutex(voice->mutex);
         alsa_voice->stopped = true;
         al_signal_cond(voice->cond);
         al_unlock_mutex(voice->mutex);
      }

      if (!alsa_voice->stop && alsa_voice->stopped) {
         alsa_voice->stopped = false;
      }

      if (alsa_voice->stopped) {
         /* Keep waiting while the voice is supposed to be stopped but present.
          */
         al_lock_mutex(voice->mutex);
         while (alsa_voice->stop && !al_get_thread_should_stop(self)) {
            al_wait_cond(voice->cond, voice->mutex);
         }
         al_unlock_mutex(voice->mutex);
         continue;
      }

      state = snd_pcm_state(alsa_voice->pcm_handle);
      if (state != last_state) {
         ALLEGRO_DEBUG("state changed to: %s\n", snd_pcm_state_name(state));
         last_state = state;
      }
      if (state == SND_PCM_STATE_SETUP) {
         int rc = snd_pcm_prepare(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_prepare returned: %d\n", rc);
         continue;
      }
      if (state == SND_PCM_STATE_PREPARED) {
         int rc = snd_pcm_start(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_start returned: %d\n", rc);
      }

      snd_pcm_wait(alsa_voice->pcm_handle, 10);
      err = snd_pcm_avail_update(alsa_voice->pcm_handle);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
         else {
            ALLEGRO_WARN("Alsa r/w thread exited "
               "with error code %s.\n", snd_strerror(-err));
            break;
         }
      }
      if (err == 0) {
         continue;
      }
      frames = err;
      if (frames > alsa_voice->frag_len)
         frames = alsa_voice->frag_len;
      /* Write sample data into the buffer. */
      int bytes = frames * alsa_voice->frame_size;
      uint8_t data[bytes];
      void *buf;
      if (!voice->is_streaming && !alsa_voice->stopped) {
         ASSERT(!alsa_voice->reversed); // FIXME
         alsa_update_nonstream_voice(voice, &buf, &bytes);
         frames = bytes / alsa_voice->frame_size;
      }
      else if (voice->is_streaming && !alsa_voice->stopped) {
         /* This should fit. */
         unsigned int iframes = frames;
         buf = (void *)_al_voice_update(voice, voice->mutex, &iframes);
         if (buf == NULL)
            goto silence;
         frames = iframes;
      }
      else {
silence:
         /* If stopped just fill with silence. */
         al_fill_silence(data, frames, voice->depth, voice->chan_conf);
         buf = data;
      }
      err = snd_pcm_writei(alsa_voice->pcm_handle, buf, frames);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
      }
   }

   ALLEGRO_INFO("ALSA update_rw thread stopped\n");

   return NULL;
}